

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O2

int adiak_mpi_library_version(void)

{
  return -1;
}

Assistant:

int adiak_mpi_library_version()
{
#if defined(USE_MPI)
   char vendor[80];
   char version[40];
   int result = -1;
   if (adiak_config->use_mpi)
      result = adksys_mpi_library_version(vendor, 80, version, 40);
   if (result == -1)
      return -1;
   adiak_namevalue("mpi_library_vendor", adiak_general, "mpi", "%s", vendor);
   adiak_namevalue("mpi_library_version", adiak_general, "mpi", "%v", version);
#endif
   return -1;
}